

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_0::CountingNetworkAddress::connect
          (CountingNetworkAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  undefined4 in_register_00000034;
  _func_int **pp_Var2;
  Own<kj::_::PromiseNode> local_28;
  
  pp_Var2 = (_func_int **)CONCAT44(in_register_00000034,__fd);
  *(int *)pp_Var2[4] = *(int *)pp_Var2[4] + 1;
  *(int *)pp_Var2[8] = *(int *)pp_Var2[8] + 1;
  (*(code *)**(undefined8 **)pp_Var2[1])(&local_28);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_28,
             _::
             TransformPromiseNode<kj::Own<kj::AsyncIoStream>,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:2816:15),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  pPVar1 = local_28.ptr;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0045d570;
  this_00[1].super_PromiseNode._vptr_PromiseNode = pp_Var2;
  (this->super_NetworkAddress)._vptr_NetworkAddress =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Own<kj::AsyncIoStream>,kj::Own<kj::AsyncIoStream>,kj::(anonymous_namespace)::CountingNetworkAddress::connect()::{lambda(kj::Own<kj::AsyncIoStream>)#1},kj::_::PropagateException>>
        ::instance;
  this->inner = (NetworkAddress *)this_00;
  if (local_28.ptr != (PromiseNode *)0x0) {
    local_28.ptr = (PromiseNode *)0x0;
    (**(local_28.disposer)->_vptr_Disposer)
              (local_28.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<kj::AsyncIoStream>> connect() override {
    ++count;
    ++cumulative;
    return inner.connect()
        .then([this](kj::Own<kj::AsyncIoStream> stream) -> kj::Own<kj::AsyncIoStream> {
      return kj::heap<CountingIoStream>(kj::mv(stream), count);
    });
  }